

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynchronizedQueue.h
# Opt level: O1

Buffer * __thiscall
SynchronizedQueue<Buffer>::get(Buffer *__return_storage_ptr__,SynchronizedQueue<Buffer> *this)

{
  int *piVar1;
  _Map_pointer ppBVar2;
  
  (__return_storage_ptr__->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Semaphore::p((Semaphore *)this);
  ppBVar2 = (this->values).c.super__Deque_base<Buffer,_std::allocator<Buffer>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  if (((long)(this->values).c.super__Deque_base<Buffer,_std::allocator<Buffer>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur -
       (long)(this->values).c.super__Deque_base<Buffer,_std::allocator<Buffer>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555 +
      (((long)ppBVar2 -
        (long)(this->values).c.super__Deque_base<Buffer,_std::allocator<Buffer>_>._M_impl.
              super__Deque_impl_data._M_start._M_node >> 3) + -1 +
      (ulong)(ppBVar2 == (_Map_pointer)0x0)) * 0x15 ==
      ((long)(this->values).c.super__Deque_base<Buffer,_std::allocator<Buffer>_>._M_impl.
             super__Deque_impl_data._M_start._M_last -
       (long)(this->values).c.super__Deque_base<Buffer,_std::allocator<Buffer>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur >> 3) * 0x5555555555555555) {
    piVar1 = &(this->isEmpty).waitingCount;
    *piVar1 = *piVar1 + 1;
    Semaphore::v((Semaphore *)this);
    Semaphore::p(&(this->isEmpty).w);
  }
  std::vector<char,_std::allocator<char>_>::operator=
            (&__return_storage_ptr__->data,
             &((this->values).c.super__Deque_base<Buffer,_std::allocator<Buffer>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur)->data);
  std::deque<Buffer,_std::allocator<Buffer>_>::pop_front(&(this->values).c);
  Semaphore::v((Semaphore *)this);
  return __return_storage_ptr__;
}

Assistant:

T SynchronizedQueue<T>::get() {
    T value;
    enter();
    if (values.size() == 0)
        Monitor::wait(isEmpty);
    value = values.front();
    values.pop();
    leave();
    return value;
}